

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

uint * Abc_NtkSuppCharStart(Vec_Int_t *vOne,int nPis)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint *__s;
  long lVar4;
  size_t __size;
  
  __size = (long)(int)(((nPis >> 5) + 1) - (uint)((nPis & 0x1fU) == 0)) << 2;
  __s = (uint *)malloc(__size);
  memset(__s,0,__size);
  iVar1 = vOne->nSize;
  if (0 < (long)iVar1) {
    piVar3 = vOne->pArray;
    lVar4 = 0;
    do {
      iVar2 = piVar3[lVar4];
      if (nPis <= iVar2) {
        __assert_fail("Entry < nPis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                      ,0x1db,"unsigned int *Abc_NtkSuppCharStart(Vec_Int_t *, int)");
      }
      __s[iVar2 >> 5] = __s[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return __s;
}

Assistant:

unsigned * Abc_NtkSuppCharStart( Vec_Int_t * vOne, int nPis )
{
    unsigned * pBuffer;
    int i, Entry;
    int nWords = Abc_BitWordNum(nPis);
    pBuffer = ABC_ALLOC( unsigned, nWords );
    memset( pBuffer, 0, sizeof(unsigned) * nWords );
    Vec_IntForEachEntry( vOne, Entry, i )
    {
        assert( Entry < nPis );
        Abc_InfoSetBit( pBuffer, Entry );
    }
    return pBuffer;
}